

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<chaiscript::AST_Node_Trace>
          (Object_Data *this,AST_Node_Trace *t,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined1 local_65 [13];
  Any local_58;
  Any local_50 [3];
  element_type *local_38;
  element_type *ptr;
  shared_ptr<chaiscript::AST_Node_Trace> p;
  bool t_return_value_local;
  AST_Node_Trace *t_local;
  
  p.super___shared_ptr<chaiscript::AST_Node_Trace,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = t_return_value;
  std::make_shared<chaiscript::AST_Node_Trace,chaiscript::AST_Node_Trace>((AST_Node_Trace *)&ptr);
  local_38 = std::__shared_ptr<chaiscript::AST_Node_Trace,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<chaiscript::AST_Node_Trace,_(__gnu_cxx::_Lock_policy)2> *)&ptr
                       );
  detail::Get_Type_Info<chaiscript::AST_Node_Trace>::get();
  detail::Any::Any<std::shared_ptr<chaiscript::AST_Node_Trace>,void>
            (&local_58,(shared_ptr<chaiscript::AST_Node_Trace> *)&ptr);
  local_65[0] = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,chaiscript::AST_Node_Trace*&,bool&>
            ((Type_Info *)this,local_50,(bool *)&local_58,(AST_Node_Trace **)local_65,
             (bool *)&local_38);
  detail::Any::~Any(&local_58);
  std::shared_ptr<chaiscript::AST_Node_Trace>::~shared_ptr
            ((shared_ptr<chaiscript::AST_Node_Trace> *)&ptr);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }